

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O3

int __thiscall
deqp::gles3::Functional::Vertex3DTextureCase::init(Vertex3DTextureCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  pointer pPVar1;
  bool bVar2;
  int extraout_EAX;
  RenderTarget *pRVar3;
  ShaderProgram *this_00;
  Texture3D *this_01;
  NotSupportedError *pNVar4;
  bool bVar5;
  pointer_____offset_0x10___ *ppuVar6;
  int levelNdx;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int levelNdx_1;
  Vec4 gMax;
  Vec4 gMin;
  Vector<float,_4> res_3;
  ProgramSources sources;
  RGBA local_1b0;
  RGBA local_1ac;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  undefined1 local_188 [8];
  undefined8 uStack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  Vec4 local_118;
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [128];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_78;
  undefined1 local_58 [40];
  
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar3->m_numSamples != 0) {
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_108 = (undefined1  [8])local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_108,"MSAA config not supported by this test","");
    tcu::NotSupportedError::NotSupportedError(pNVar4,(string *)local_108);
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  local_188 = (undefined1  [8])&local_178;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_188,
             "#version 300 es\nin highp vec2 a_position;\nin highp vec3 a_texCoord;\nuniform highp sampler3D u_texture;\nuniform highp float u_lod;\nout mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,"");
  local_1a8 = (undefined1  [8])&local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\n\nvoid main()\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,"");
  memset((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_108,0,0xac);
  local_58._0_8_ = (pointer)0x0;
  local_58[8] = 0;
  local_58._9_7_ = 0;
  local_58[0x10] = 0;
  local_58._17_8_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_108,(value_type *)local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_f8 + 8),(value_type *)local_1a8);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,(ProgramSources *)local_108);
  this->m_program = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_78);
  lVar10 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_108 + lVar10));
    lVar10 = lVar10 + -0x18;
  } while (lVar10 != -0x18);
  if (local_1a8 != (undefined1  [8])&local_198) {
    operator_delete((void *)local_1a8,local_198._M_allocated_capacity + 1);
  }
  if (local_188 != (undefined1  [8])&local_178) {
    operator_delete((void *)local_188,local_178._M_allocated_capacity + 1);
  }
  if ((this->m_program->m_program).m_info.linkOk == true) {
    lVar10 = 0;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      this_01 = (Texture3D *)operator_new(0x70);
      glu::Texture3D::Texture3D
                (this_01,((this->super_TestCase).m_context)->m_renderCtx,0x1907,0x1401,0x40,0x40,
                 0x40);
      this->m_textures[lVar10] = this_01;
      lVar10 = 1;
      bVar2 = false;
    } while (bVar5);
    tcu::getTextureFormatInfo
              ((TextureFormatInfo *)local_108,(TextureFormat *)&this->m_textures[0]->m_refTexture);
    local_168 = (float)local_f8._0_4_ - (float)local_108._0_4_;
    fStack_164 = (float)local_f8._4_4_ - (float)local_108._4_4_;
    fStack_160 = (float)local_f8._8_4_ - fStack_100;
    fStack_15c = (float)local_f8._12_4_ - fStack_fc;
    local_138 = local_168 * -0.5 + (float)local_108._0_4_;
    fStack_134 = fStack_164 * -0.5 + (float)local_108._4_4_;
    fStack_130 = fStack_160 * -0.5 + fStack_100;
    fStack_12c = fStack_15c * 2.0 + fStack_fc;
    local_158 = (float)local_108._0_4_;
    fStack_154 = (float)local_108._4_4_;
    fStack_150 = fStack_100;
    fStack_14c = fStack_fc;
    local_148 = local_168 * 1.0 + (float)local_108._0_4_;
    fStack_144 = fStack_164 * 1.0 + (float)local_108._4_4_;
    fStack_140 = fStack_160 * 1.0 + fStack_100;
    fStack_13c = fStack_15c * 0.0 + fStack_fc;
    lVar8 = 0;
    lVar10 = 0;
    do {
      local_188 = (undefined1  [8])CONCAT44(fStack_134,local_138);
      uStack_180 = CONCAT44(fStack_12c,fStack_130);
      local_1a8 = (undefined1  [8])CONCAT44(fStack_144,local_148);
      uStack_1a0 = CONCAT44(fStack_13c,fStack_140);
      tcu::Texture3D::allocLevel(&this->m_textures[0]->m_refTexture,(int)lVar10);
      tcu::fillWithComponentGradients
                ((PixelBufferAccess *)
                 ((long)(((this->m_textures[0]->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + lVar8 + -8),(Vec4 *)local_188,(Vec4 *)local_1a8);
      lVar10 = lVar10 + 1;
      lVar8 = lVar8 + 0x28;
    } while (lVar10 != 7);
    uVar7 = 0xffffffff;
    lVar10 = 0;
    uVar9 = 0;
    lVar8 = 0;
    do {
      tcu::Texture3D::allocLevel(&this->m_textures[1]->m_refTexture,(int)lVar8);
      local_1ac.m_value = uVar9 | 0xff000000;
      pPVar1 = (this->m_textures[1]->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec(&local_1ac);
      local_1b0.m_value = uVar7 | 0xff000000;
      local_188._4_4_ = (float)local_1a8._4_4_ * fStack_164 + fStack_154;
      local_188._0_4_ = (float)local_1a8._0_4_ * local_168 + local_158;
      uStack_180 = CONCAT44(uStack_1a0._4_4_ * fStack_15c + fStack_14c,
                            (float)uStack_1a0 * fStack_160 + fStack_150);
      tcu::RGBA::toVec(&local_1b0);
      local_118.m_data[0] = local_128 * local_168 + local_158;
      local_118.m_data[1] = fStack_124 * fStack_164 + fStack_154;
      local_118.m_data[2] = fStack_120 * fStack_160 + fStack_150;
      local_118.m_data[3] = fStack_11c * fStack_15c + fStack_14c;
      tcu::fillWithGrid((PixelBufferAccess *)
                        ((long)(pPVar1->super_ConstPixelBufferAccess).m_size.m_data + lVar10 + -8),4
                        ,(Vec4 *)local_188,&local_118);
      lVar8 = lVar8 + 1;
      uVar7 = uVar7 - 0x249249;
      uVar9 = uVar9 + 0x249249;
      lVar10 = lVar10 + 0x28;
    } while (lVar8 != 7);
    glu::Texture3D::upload(this->m_textures[0]);
    glu::Texture3D::upload(this->m_textures[1]);
    return extraout_EAX;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  glwGetIntegerv(0x8b4c,(GLint *)local_108);
  pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  if ((int)local_108._0_4_ < 1) {
    tcu::NotSupportedError::NotSupportedError
              (pNVar4,"Vertex texture image units not supported","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
               ,0x616);
    ppuVar6 = &tcu::NotSupportedError::typeinfo;
  }
  else {
    tcu::TestError::TestError
              ((TestError *)pNVar4,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
               ,0x618);
    ppuVar6 = &tcu::TestError::typeinfo;
  }
  __cxa_throw(pNVar4,ppuVar6,tcu::Exception::~Exception);
}

Assistant:

void Vertex3DTextureCase::init (void)
{
	const char* const vertexShaderSource =
		"#version 300 es\n"
		"in highp vec2 a_position;\n"
		"in highp vec3 a_texCoord;\n"
		"uniform highp sampler3D u_texture;\n"
		"uniform highp float u_lod;\n"
		"out mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShaderSource =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
		"in mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	dEQP_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	// Create shader.

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.

	try
	{
		const int texWidth	= WIDTH_3D;
		const int texHeight	= HEIGHT_3D;
		const int texDepth	= DEPTH_3D;

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::Texture3D(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight, texDepth);
		}

		const int						numLevels	= deLog2Floor32(de::max(de::max(texWidth, texHeight), texDepth)) + 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const Vec4 gMin = Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
			const Vec4 gMax = Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const deUint32 step		= 0x00ffffff / numLevels;
			const deUint32 rgb		= step*levelNdx;
			const deUint32 colorA	= 0xff000000 | rgb;
			const deUint32 colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Vertex3DTextureCase::deinit();
		throw;
	}
}